

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

void __thiscall
Assembler::processLdStrRegDir(Assembler *this,string *instruction,int reg,string *operand)

{
  string local_50;
  int local_2c;
  string *psStack_28;
  int adr;
  string *operand_local;
  string *psStack_18;
  int reg_local;
  string *instruction_local;
  Assembler *this_local;
  
  local_2c = 1;
  psStack_28 = operand;
  operand_local._4_4_ = reg;
  psStack_18 = instruction;
  instruction_local = &this->inputFileName;
  std::__cxx11::string::string((string *)&local_50,(string *)instruction);
  instr3Bytes(this,&local_50,operand_local._4_4_,local_2c);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void Assembler::processLdStrRegDir(string instruction, int reg, string operand) {
    int adr = 0x01;

    instr3Bytes(instruction, reg, adr);
    return;

}